

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_11_dq_string_inner(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_append_string(&G->data,(G->data).literal_str,"\b",1);
  (G->data).literal_str = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_11_dq_string_inner(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define v G->val[-1]
#define k G->val[-2]
#define h G->val[-3]
#define e G->val[-4]
  yyprintf((stderr, "do yy_11_dq_string_inner"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {APPEND_S(\"\\b\", 1); }\n"));
  APPEND_S("\b", 1); ;
#undef v
#undef k
#undef h
#undef e
}